

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int reinstall_initial_encryption(quicly_conn_t *conn,int err_code_if_unknown_version)

{
  uint32_t uVar1;
  st_quicly_handshake_space_t *psVar2;
  ptls_cipher_suite_t *cs;
  ptls_iovec_t salt;
  ptls_cipher_suite_t **pppVar3;
  undefined1 *puVar4;
  uint8_t *puVar5;
  ptls_iovec_t cid;
  
  uVar1 = (conn->super).version;
  puVar4 = (uint8_t *)0x0;
  if (uVar1 == 0xff00001b) {
    puVar4 = get_salt_draft27;
  }
  puVar5 = get_salt_current;
  if (uVar1 != 0xff00001d) {
    puVar5 = puVar4;
  }
  if (puVar5 != (uint8_t *)0x0) {
    psVar2 = conn->initial;
    ptls_aead_free((psVar2->cipher).ingress.aead);
    ptls_cipher_free((psVar2->cipher).ingress.header_protection);
    psVar2 = conn->initial;
    ptls_aead_free((psVar2->cipher).egress.aead);
    ptls_cipher_free((psVar2->cipher).egress.header_protection);
    pppVar3 = ((conn->super).ctx)->tls->cipher_suites;
    if (pppVar3 == (ptls_cipher_suite_t **)0x0) {
      __assert_fail("cs != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x210,"ptls_cipher_suite_t *get_aes128gcmsha256(quicly_context_t *)");
    }
    do {
      cs = *pppVar3;
      pppVar3 = pppVar3 + 1;
    } while (cs->id != 0x1301);
    salt.len = 0x14;
    salt.base = puVar5;
    cid.len._0_1_ = (conn->super).remote.cid_set.cids[0].cid.len;
    cid.base = (conn->super).remote.cid_set.cids[0].cid.cid;
    cid.len._1_7_ = 0;
    err_code_if_unknown_version =
         setup_initial_encryption
                   (cs,&(conn->initial->cipher).ingress,&(conn->initial->cipher).egress,cid,1,salt,
                    (quicly_conn_t *)0x0);
  }
  return err_code_if_unknown_version;
}

Assistant:

static int reinstall_initial_encryption(quicly_conn_t *conn, int err_code_if_unknown_version)
{
    const struct st_ptls_salt_t *salt;

    /* get salt */
    if ((salt = get_salt(conn->super.version)) == NULL)
        return err_code_if_unknown_version;

    /* dispose existing context */
    dispose_cipher(&conn->initial->cipher.ingress);
    dispose_cipher(&conn->initial->cipher.egress);

    /* setup encryption context */
    return setup_initial_encryption(
        get_aes128gcmsha256(conn->super.ctx), &conn->initial->cipher.ingress, &conn->initial->cipher.egress,
        ptls_iovec_init(conn->super.remote.cid_set.cids[0].cid.cid, conn->super.remote.cid_set.cids[0].cid.len), 1,
        ptls_iovec_init(salt->initial, sizeof(salt->initial)), NULL);
}